

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O0

int run_test_handle_fileno(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_21;
  int64_t eval_a_21;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  uv_idle_t idle;
  uv_tty_t tty;
  uv_pipe_t pipe;
  uv_udp_t udp;
  uv_tcp_t tcp;
  undefined1 local_28 [4];
  uv_os_fd_t fd;
  sockaddr_in addr;
  uv_os_fd_t tty_fd;
  int r;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_28);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x37,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ = uv_idle_init(loop_00,&loop);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x3a,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&loop,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x3c,"r","==","UV_EINVAL",(long)(int)addr.sin_zero._4_4_,"==",0xffffffffffffffea);
    abort();
  }
  uv_close(&loop,0);
  addr.sin_zero._4_4_ = uv_tcp_init(loop_00,&udp.write_completed_queue.prev);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x40,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(&udp.write_completed_queue.prev,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x42,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
    abort();
  }
  addr.sin_zero._4_4_ = uv_tcp_bind(&udp.write_completed_queue.prev,local_28,0);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x44,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(&udp.write_completed_queue.prev,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x46,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  uv_close(&udp.write_completed_queue.prev,0);
  addr.sin_zero._4_4_ =
       uv_fileno(&udp.write_completed_queue.prev,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x49,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
    abort();
  }
  addr.sin_zero._4_4_ = uv_udp_init(loop_00,&pipe.pipe_fname);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x4c,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x4e,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
    abort();
  }
  addr.sin_zero._4_4_ = uv_udp_bind(&pipe.pipe_fname,local_28,0);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x50,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x52,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  uv_close(&pipe.pipe_fname,0);
  addr.sin_zero._4_4_ = uv_fileno(&pipe.pipe_fname,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x55,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
    abort();
  }
  addr.sin_zero._4_4_ = uv_pipe_init(loop_00,&tty.orig_termios.c_ospeed,0);
  if ((long)(int)addr.sin_zero._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x58,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
    abort();
  }
  addr.sin_zero._4_4_ =
       uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
  if ((long)(int)addr.sin_zero._4_4_ != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x5a,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
    abort();
  }
  addr.sin_zero._4_4_ = uv_pipe_bind(&tty.orig_termios.c_ospeed,"/tmp/uv-test-sock");
  if ((long)(int)addr.sin_zero._4_4_ == 0) {
    addr.sin_zero._4_4_ =
         uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
    if ((long)(int)addr.sin_zero._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
              ,0x5e,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
      abort();
    }
    uv_close(&tty.orig_termios.c_ospeed,0);
    addr.sin_zero._4_4_ =
         uv_fileno(&tty.orig_termios.c_ospeed,(undefined1 *)((long)&tcp.queued_fds + 4));
    if ((long)(int)addr.sin_zero._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
              ,0x61,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
      abort();
    }
    addr.sin_zero._0_4_ = get_tty_fd();
    if (addr.sin_zero._0_4_ == -1) {
      fprintf(_stderr,"Cannot open a TTY fd");
      fflush(_stderr);
    }
    else {
      addr.sin_zero._4_4_ = uv_tty_init(loop_00,&idle.queue.prev,addr.sin_zero._0_4_,0);
      if ((long)(int)addr.sin_zero._4_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x69,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
        abort();
      }
      iVar1 = uv_is_readable(&idle.queue.prev);
      if (iVar1 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x6a,"uv_is_readable((uv_stream_t*) &tty)");
        abort();
      }
      iVar1 = uv_is_writable(&idle.queue.prev);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x6b,"!uv_is_writable((uv_stream_t*) &tty)");
        abort();
      }
      addr.sin_zero._4_4_ = uv_fileno(&idle.queue.prev,(undefined1 *)((long)&tcp.queued_fds + 4));
      if ((long)(int)addr.sin_zero._4_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x6d,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
        abort();
      }
      uv_close(&idle.queue.prev,0);
      addr.sin_zero._4_4_ = uv_fileno(&idle.queue.prev,(undefined1 *)((long)&tcp.queued_fds + 4));
      if ((long)(int)addr.sin_zero._4_4_ != -9) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x70,"r","==","UV_EBADF",(long)(int)addr.sin_zero._4_4_,"==",0xfffffffffffffff7);
        abort();
      }
      iVar1 = uv_is_readable(&idle.queue.prev);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x71,"!uv_is_readable((uv_stream_t*) &tty)");
        abort();
      }
      iVar1 = uv_is_writable(&idle.queue.prev);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
                ,0x72,"!uv_is_writable((uv_stream_t*) &tty)");
        abort();
      }
    }
    uv_run(loop_00,0);
    close_loop(loop_00);
    iVar1 = uv_loop_close(loop_00);
    if ((long)iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
            ,0x77,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-handle-fileno.c"
          ,0x5c,"r","==","0",(long)(int)addr.sin_zero._4_4_,"==",0);
  abort();
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  uv_os_fd_t tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT_EQ(r, UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd == (uv_os_fd_t)-1) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT_OK(r);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_OK(r);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_EQ(r, UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}